

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue_writer.c
# Opt level: O0

int main(void)

{
  key_t __key;
  int __msqid;
  size_t len;
  int msgid;
  key_t key;
  
  __key = ftok("progfile",0x41);
  __msqid = msgget(__key,0x3b6);
  message.mesg_type = 1;
  printf("Write Data : ");
  fgets(message.mesg_text,100,_stdin);
  msgsnd(__msqid,&message,0x70,0);
  printf("Data send is : %s \n",0x104060);
  return 0;
}

Assistant:

int main() 
{ 
    key_t key; 
    int msgid; 
    size_t len = 0;
  
    // ftok to generate unique key 
    key = ftok("progfile", 65); 
  
    // msgget creates a message queue 
    // and returns identifier 
    msgid = msgget(key, 0666 | IPC_CREAT); 
    message.mesg_type = 1; 
  
    printf("Write Data : "); 
    
    fgets(message.mesg_text, 100, stdin); 
    
  
    // msgsnd to send message 
    msgsnd(msgid, &message, sizeof(message), 0); 
  
    // display the message 
    printf("Data send is : %s \n", message.mesg_text); 
  
    return 0; 
}